

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

SynIfElse * ParseIfElse(ParseContext *ctx,bool forceStaticIf)

{
  Lexeme *begin;
  int iVar1;
  SynBase *this;
  SynVariableDefinition *node;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SynBase *pSVar2;
  undefined4 extraout_var_01;
  Lexeme *pLVar3;
  SynIfElse *this_00;
  undefined4 extraout_var_02;
  SynIfElse *this_01;
  LexemeType LVar4;
  bool forceStaticIf_00;
  undefined7 in_register_00000031;
  IntrusiveList<SynVariableDefinition> definitions;
  IntrusiveList<SynVariableDefinition> local_58;
  SynVariableDefinition *local_48;
  SynVariableDefinition *pSStack_40;
  undefined4 extraout_var_03;
  
  begin = ctx->currentLexeme;
  LVar4 = begin->type;
  if ((int)CONCAT71(in_register_00000031,forceStaticIf) == 0) {
    if (LVar4 != lex_if) {
      if (LVar4 != lex_at) {
        return (SynIfElse *)0x0;
      }
      if (begin[1].type != lex_if) {
        return (SynIfElse *)0x0;
      }
      pLVar3 = begin + 2;
      goto LAB_00118d89;
    }
    ctx->currentLexeme = begin + 1;
    forceStaticIf_00 = false;
    anon_unknown.dwarf_151f2::CheckConsume(ctx,lex_oparen,"ERROR: \'(\' not found after \'if\'");
    pLVar3 = ctx->currentLexeme;
    pSVar2 = ParseType(ctx,(bool *)0x0,false);
    if (pSVar2 == (SynBase *)0x0) goto LAB_00118da9;
    local_58.head = (SynVariableDefinition *)0x0;
    local_58.tail = (SynVariableDefinition *)0x0;
    node = ParseVariableDefinition(ctx);
    if (node == (SynVariableDefinition *)0x0) {
      ctx->currentLexeme = pLVar3;
      forceStaticIf_00 = false;
      goto LAB_00118da9;
    }
    IntrusiveList<SynVariableDefinition>::push_back(&local_58,node);
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x60);
    this = (SynBase *)CONCAT44(extraout_var,iVar1);
    if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_001190a8;
    local_48 = local_58.head;
    pSStack_40 = local_58.tail;
    SynBase::SynBase(this,0x34,begin,ctx->currentLexeme + -1);
    this->_vptr_SynBase = (_func_int **)&PTR__SynBase_0023fb38;
    this[1]._vptr_SynBase = (_func_int **)0x0;
    *(SynBase **)&this[1].typeID = pSVar2;
    this[1].begin = (Lexeme *)local_48;
    this[1].end = (Lexeme *)pSStack_40;
    forceStaticIf_00 = false;
  }
  else {
    if (LVar4 != lex_if) {
      return (SynIfElse *)0x0;
    }
    pLVar3 = begin + 1;
LAB_00118d89:
    ctx->currentLexeme = pLVar3;
    anon_unknown.dwarf_151f2::CheckConsume(ctx,lex_oparen,"ERROR: \'(\' not found after \'if\'");
    forceStaticIf_00 = true;
LAB_00118da9:
    this = ParseAssignment(ctx);
    if (this == (SynBase *)0x0) {
      anon_unknown.dwarf_151f2::Report
                (ctx,ctx->currentLexeme,"ERROR: condition not found in \'if\' statement");
      iVar1 = (*ctx->allocator->_vptr_Allocator[2])();
      this = (SynBase *)CONCAT44(extraout_var_00,iVar1);
      SynBase::SynBase(this,0,ctx->currentLexeme,ctx->currentLexeme);
      this->_vptr_SynBase = (_func_int **)&PTR__SynBase_0023f208;
    }
  }
  anon_unknown.dwarf_151f2::CheckConsume
            (ctx,lex_cparen,"ERROR: closing \')\' not found after \'if\' condition");
  pSVar2 = ParseExpression(ctx);
  if (pSVar2 == (SynBase *)0x0) {
    anon_unknown.dwarf_151f2::Report
              (ctx,ctx->currentLexeme,"ERROR: expression not found after \'if\'");
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])();
    pSVar2 = (SynBase *)CONCAT44(extraout_var_01,iVar1);
    SynBase::SynBase(pSVar2,0,ctx->currentLexeme,ctx->currentLexeme);
    pSVar2->_vptr_SynBase = (_func_int **)&PTR__SynBase_0023f208;
  }
  pLVar3 = ctx->currentLexeme;
  if (forceStaticIf_00 == false) {
LAB_00118f73:
    LVar4 = pLVar3->type;
  }
  else {
    LVar4 = pLVar3->type;
    if (LVar4 == lex_semicolon) {
      pLVar3 = pLVar3 + 1;
      ctx->currentLexeme = pLVar3;
      goto LAB_00118f73;
    }
  }
  if (LVar4 == lex_else) {
    ctx->currentLexeme = pLVar3 + 1;
    if (pLVar3[1].type == lex_if) {
      this_00 = ParseIfElse(ctx,forceStaticIf_00);
    }
    else {
      this_00 = (SynIfElse *)ParseExpression(ctx);
    }
    if (this_00 == (SynIfElse *)0x0) {
      anon_unknown.dwarf_151f2::Report
                (ctx,ctx->currentLexeme,"ERROR: expression not found after \'else\'");
      iVar1 = (*ctx->allocator->_vptr_Allocator[2])();
      this_00 = (SynIfElse *)CONCAT44(extraout_var_02,iVar1);
      SynBase::SynBase((SynBase *)this_00,0,ctx->currentLexeme,ctx->currentLexeme);
      (this_00->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_0023f208;
    }
    if ((forceStaticIf_00 != false) && (ctx->currentLexeme->type == lex_semicolon)) {
      ctx->currentLexeme = ctx->currentLexeme + 1;
    }
  }
  else {
    this_00 = (SynIfElse *)0x0;
  }
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
  this_01 = (SynIfElse *)CONCAT44(extraout_var_03,iVar1);
  if (ctx->firstLexeme < ctx->currentLexeme) {
    SynBase::SynBase((SynBase *)this_01,0x27,begin,ctx->currentLexeme + -1);
    (this_01->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_0023fb70;
    (this_01->super_SynBase).field_0x3a = forceStaticIf_00;
    this_01->condition = this;
    this_01->trueBlock = pSVar2;
    this_01->falseBlock = &this_00->super_SynBase;
    return this_01;
  }
LAB_001190a8:
  __assert_fail("currentLexeme > firstLexeme",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                ,0x19c,"Lexeme *ParseContext::Previous()");
}

Assistant:

SynIfElse* ParseIfElse(ParseContext &ctx, bool forceStaticIf)
{
	Lexeme *start = ctx.currentLexeme;

	bool staticIf = forceStaticIf || ctx.Consume(lex_at);

	if(ctx.Consume(lex_if))
	{
		CheckConsume(ctx, lex_oparen, "ERROR: '(' not found after 'if'");

		Lexeme *conditionPos = ctx.currentLexeme;

		SynBase *condition = NULL;

		if(!staticIf)
		{
			if(SynBase *type = ParseType(ctx))
			{
				IntrusiveList<SynVariableDefinition> definitions;

				if(SynVariableDefinition *definition = ParseVariableDefinition(ctx))
				{
					definitions.push_back(definition);

					condition = new (ctx.get<SynVariableDefinitions>()) SynVariableDefinitions(start, ctx.Previous(), NULL, type, definitions);
				}
				else
				{
					ctx.currentLexeme = conditionPos;
				}
			}
		}

		if(!condition)
			condition = ParseAssignment(ctx);

		if(!condition)
		{
			Report(ctx, ctx.Current(), "ERROR: condition not found in 'if' statement");

			condition = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		CheckConsume(ctx, lex_cparen, "ERROR: closing ')' not found after 'if' condition");

		SynBase *trueBlock = ParseExpression(ctx);

		if(!trueBlock)
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after 'if'");

			trueBlock = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		SynBase *falseBlock = NULL;

		if(staticIf && ctx.At(lex_semicolon))
			ctx.Skip();

		if(ctx.Consume(lex_else))
		{
			if(ctx.At(lex_if))
				falseBlock = ParseIfElse(ctx, staticIf);
			else
				falseBlock = ParseExpression(ctx);

			if(!falseBlock)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after 'else'");

				falseBlock = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}

			if(staticIf && ctx.At(lex_semicolon))
				ctx.Skip();
		}

		return new (ctx.get<SynIfElse>()) SynIfElse(start, ctx.Previous(), staticIf, condition, trueBlock, falseBlock);
	}

	if(staticIf)
	{
		// Backtrack
		ctx.currentLexeme = start;
	}

	return NULL;
}